

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  float *pfVar5;
  float *pfVar6;
  long lVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  int iVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  Scene *pSVar31;
  Geometry *pGVar32;
  long lVar33;
  long lVar34;
  RTCFilterFunctionN p_Var35;
  bool bVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined8 uVar42;
  undefined8 uVar43;
  int iVar44;
  AABBNodeMB4D *node1;
  ulong uVar45;
  ulong uVar46;
  RTCRayN *pRVar47;
  size_t sVar48;
  ulong uVar49;
  long lVar50;
  undefined4 uVar51;
  ulong unaff_RBX;
  size_t mask;
  uint uVar52;
  NodeRef *pNVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  uint uVar63;
  ulong uVar64;
  ulong uVar65;
  bool bVar66;
  bool bVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar89;
  float fVar90;
  undefined1 auVar88 [16];
  float fVar91;
  float fVar97;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar104;
  float fVar106;
  undefined1 auVar102 [16];
  float fVar105;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar103 [16];
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar132 [16];
  float fVar139;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar140 [16];
  float fVar144;
  float fVar145;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  undefined1 auVar146 [16];
  float fVar153;
  float fVar154;
  float fVar157;
  float fVar158;
  float fVar159;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar163 [16];
  UVIdentity<4> mapUV;
  float local_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  undefined8 local_b68;
  float fStack_b40;
  float fStack_b3c;
  float fStack_ab0;
  float fStack_aac;
  undefined1 local_aa8 [16];
  undefined1 (*local_a98) [16];
  ulong local_a90;
  ulong local_a88;
  NodeRef *local_a80;
  RTCFilterFunctionNArguments args;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  UVIdentity<4> *local_8e8;
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  RTCHitN local_868 [16];
  undefined4 local_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined4 local_848;
  undefined4 uStack_844;
  undefined4 uStack_840;
  undefined4 uStack_83c;
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  uint local_808;
  uint uStack_804;
  uint uStack_800;
  uint uStack_7fc;
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint local_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  stack[0] = root;
  fVar25 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar26 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar27 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar76 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar85 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar91 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar98 = fVar76 * 0.99999964;
  fVar99 = fVar85 * 0.99999964;
  fVar68 = fVar91 * 0.99999964;
  fVar76 = fVar76 * 1.0000004;
  fVar85 = fVar85 * 1.0000004;
  fVar91 = fVar91 * 1.0000004;
  uVar58 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar60 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar64 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar28 = (tray->tnear).field_0.i[k];
  iVar44 = (tray->tfar).field_0.i[k];
  auVar70._4_4_ = iVar44;
  auVar70._0_4_ = iVar44;
  auVar70._8_4_ = iVar44;
  auVar70._12_4_ = iVar44;
  local_a98 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  pNVar53 = stack + 1;
  local_b68 = k;
  do {
    local_a80 = pNVar53;
    if (local_a80 == stack) break;
    pNVar53 = local_a80 + -1;
    sVar48 = local_a80[-1].ptr;
    do {
      if ((sVar48 & 8) == 0) {
        uVar45 = sVar48 & 0xfffffffffffffff0;
        fVar69 = *(float *)(ray + k * 4 + 0x70);
        pfVar22 = (float *)(uVar45 + 0x80 + uVar58);
        pfVar21 = (float *)(uVar45 + 0x20 + uVar58);
        auVar93._0_4_ = ((*pfVar22 * fVar69 + *pfVar21) - fVar25) * fVar98;
        auVar93._4_4_ = ((pfVar22[1] * fVar69 + pfVar21[1]) - fVar25) * fVar98;
        auVar93._8_4_ = ((pfVar22[2] * fVar69 + pfVar21[2]) - fVar25) * fVar98;
        auVar93._12_4_ = ((pfVar22[3] * fVar69 + pfVar21[3]) - fVar25) * fVar98;
        auVar77._4_4_ = iVar28;
        auVar77._0_4_ = iVar28;
        auVar77._8_4_ = iVar28;
        auVar77._12_4_ = iVar28;
        pfVar22 = (float *)(uVar45 + 0x80 + uVar60);
        pfVar21 = (float *)(uVar45 + 0x20 + uVar60);
        auVar77 = maxps(auVar77,auVar93);
        auVar92._0_4_ = ((*pfVar22 * fVar69 + *pfVar21) - fVar26) * fVar99;
        auVar92._4_4_ = ((pfVar22[1] * fVar69 + pfVar21[1]) - fVar26) * fVar99;
        auVar92._8_4_ = ((pfVar22[2] * fVar69 + pfVar21[2]) - fVar26) * fVar99;
        auVar92._12_4_ = ((pfVar22[3] * fVar69 + pfVar21[3]) - fVar26) * fVar99;
        pfVar22 = (float *)(uVar45 + 0x80 + uVar64);
        pfVar21 = (float *)(uVar45 + 0x20 + uVar64);
        auVar96._0_4_ = ((*pfVar22 * fVar69 + *pfVar21) - fVar27) * fVar68;
        auVar96._4_4_ = ((pfVar22[1] * fVar69 + pfVar21[1]) - fVar27) * fVar68;
        auVar96._8_4_ = ((pfVar22[2] * fVar69 + pfVar21[2]) - fVar27) * fVar68;
        auVar96._12_4_ = ((pfVar22[3] * fVar69 + pfVar21[3]) - fVar27) * fVar68;
        auVar93 = maxps(auVar92,auVar96);
        auVar77 = maxps(auVar77,auVar93);
        pfVar22 = (float *)(uVar45 + 0x80 + (uVar58 ^ 0x10));
        pfVar21 = (float *)(uVar45 + 0x20 + (uVar58 ^ 0x10));
        auVar94._0_4_ = ((*pfVar22 * fVar69 + *pfVar21) - fVar25) * fVar76;
        auVar94._4_4_ = ((pfVar22[1] * fVar69 + pfVar21[1]) - fVar25) * fVar76;
        auVar94._8_4_ = ((pfVar22[2] * fVar69 + pfVar21[2]) - fVar25) * fVar76;
        auVar94._12_4_ = ((pfVar22[3] * fVar69 + pfVar21[3]) - fVar25) * fVar76;
        auVar93 = minps(auVar70,auVar94);
        pfVar23 = (float *)(uVar45 + 0x80 + (uVar60 ^ 0x10));
        pfVar21 = (float *)(uVar45 + 0x20 + (uVar60 ^ 0x10));
        pfVar24 = (float *)(uVar45 + 0x80 + (uVar64 ^ 0x10));
        pfVar22 = (float *)(uVar45 + 0x20 + (uVar64 ^ 0x10));
        auVar95._0_4_ = ((*pfVar23 * fVar69 + *pfVar21) - fVar26) * fVar85;
        auVar95._4_4_ = ((pfVar23[1] * fVar69 + pfVar21[1]) - fVar26) * fVar85;
        auVar95._8_4_ = ((pfVar23[2] * fVar69 + pfVar21[2]) - fVar26) * fVar85;
        auVar95._12_4_ = ((pfVar23[3] * fVar69 + pfVar21[3]) - fVar26) * fVar85;
        auVar102._0_4_ = ((*pfVar24 * fVar69 + *pfVar22) - fVar27) * fVar91;
        auVar102._4_4_ = ((pfVar24[1] * fVar69 + pfVar22[1]) - fVar27) * fVar91;
        auVar102._8_4_ = ((pfVar24[2] * fVar69 + pfVar22[2]) - fVar27) * fVar91;
        auVar102._12_4_ = ((pfVar24[3] * fVar69 + pfVar22[3]) - fVar27) * fVar91;
        auVar96 = minps(auVar95,auVar102);
        auVar93 = minps(auVar93,auVar96);
        bVar66 = auVar77._0_4_ <= auVar93._0_4_;
        bVar67 = auVar77._4_4_ <= auVar93._4_4_;
        bVar36 = auVar77._8_4_ <= auVar93._8_4_;
        bVar37 = auVar77._12_4_ <= auVar93._12_4_;
        if (((uint)sVar48 & 7) == 6) {
          bVar66 = (fVar69 < *(float *)(uVar45 + 0xf0) && *(float *)(uVar45 + 0xe0) <= fVar69) &&
                   bVar66;
          bVar67 = (fVar69 < *(float *)(uVar45 + 0xf4) && *(float *)(uVar45 + 0xe4) <= fVar69) &&
                   bVar67;
          bVar36 = (fVar69 < *(float *)(uVar45 + 0xf8) && *(float *)(uVar45 + 0xe8) <= fVar69) &&
                   bVar36;
          bVar37 = (fVar69 < *(float *)(uVar45 + 0xfc) && *(float *)(uVar45 + 0xec) <= fVar69) &&
                   bVar37;
        }
        auVar78._0_4_ = (uint)bVar66 * -0x80000000;
        auVar78._4_4_ = (uint)bVar67 * -0x80000000;
        auVar78._8_4_ = (uint)bVar36 * -0x80000000;
        auVar78._12_4_ = (uint)bVar37 * -0x80000000;
        uVar51 = movmskps((int)unaff_RBX,auVar78);
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar51);
      }
      if ((sVar48 & 8) == 0) {
        if (unaff_RBX == 0) {
          uVar63 = 4;
        }
        else {
          uVar45 = sVar48 & 0xfffffffffffffff0;
          lVar50 = 0;
          if (unaff_RBX != 0) {
            for (; (unaff_RBX >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
            }
          }
          uVar63 = 0;
          sVar48 = *(size_t *)(uVar45 + lVar50 * 8);
          uVar49 = unaff_RBX - 1 & unaff_RBX;
          if (uVar49 != 0) {
            pNVar53->ptr = sVar48;
            lVar50 = 0;
            if (uVar49 != 0) {
              for (; (uVar49 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
              }
            }
            uVar46 = uVar49 - 1;
            while( true ) {
              pNVar53 = pNVar53 + 1;
              sVar48 = *(size_t *)(uVar45 + lVar50 * 8);
              uVar46 = uVar46 & uVar49;
              if (uVar46 == 0) break;
              pNVar53->ptr = sVar48;
              lVar50 = 0;
              if (uVar46 != 0) {
                for (; (uVar46 >> lVar50 & 1) == 0; lVar50 = lVar50 + 1) {
                }
              }
              uVar49 = uVar46 - 1;
            }
          }
        }
      }
      else {
        uVar63 = 6;
      }
    } while (uVar63 == 0);
    if (uVar63 == 6) {
      uVar63 = 0;
      local_a90 = (ulong)((uint)sVar48 & 0xf) - 8;
      bVar66 = local_a90 != 0;
      if (bVar66) {
        uVar45 = sVar48 & 0xfffffffffffffff0;
        local_a88 = 0;
        sVar48 = k;
        do {
          k = local_b68;
          lVar50 = local_a88 * 0x50;
          pSVar31 = context->scene;
          pGVar32 = (pSVar31->geometries).items[*(uint *)(uVar45 + 0x30 + lVar50)].ptr;
          fVar69 = (pGVar32->time_range).lower;
          fVar86 = (pGVar32->time_range).upper - fVar69;
          fVar114 = ((*(float *)(ray + sVar48 * 4 + 0x70) - fVar69) / fVar86) *
                    pGVar32->fnumTimeSegments;
          auVar88 = roundss(ZEXT416((uint)fVar86),ZEXT416((uint)fVar114),9);
          fVar69 = pGVar32->fnumTimeSegments + -1.0;
          if (fVar69 <= auVar88._0_4_) {
            auVar88._0_4_ = fVar69;
          }
          fVar69 = 0.0;
          if (0.0 <= auVar88._0_4_) {
            fVar69 = auVar88._0_4_;
          }
          uVar65 = (ulong)*(uint *)(uVar45 + 4 + lVar50);
          lVar33 = *(long *)(*(long *)&pGVar32[2].numPrimitives + (long)(int)fVar69 * 0x38);
          lVar34 = *(long *)(*(long *)&pGVar32[2].numPrimitives + 0x38 + (long)(int)fVar69 * 0x38);
          pfVar21 = (float *)(lVar33 + (ulong)*(uint *)(uVar45 + lVar50) * 4);
          uVar49 = (ulong)*(uint *)(uVar45 + 0x10 + lVar50);
          pfVar22 = (float *)(lVar33 + uVar49 * 4);
          uVar46 = (ulong)*(uint *)(uVar45 + 0x20 + lVar50);
          puVar1 = (undefined8 *)(lVar33 + uVar46 * 4);
          uVar42 = *puVar1;
          uVar43 = puVar1[1];
          pfVar23 = (float *)(lVar33 + uVar65 * 4);
          uVar54 = (ulong)*(uint *)(uVar45 + 0x14 + lVar50);
          pfVar24 = (float *)(lVar33 + uVar54 * 4);
          uVar55 = (ulong)*(uint *)(uVar45 + 0x24 + lVar50);
          pfVar2 = (float *)(lVar33 + uVar55 * 4);
          uVar62 = (ulong)*(uint *)(uVar45 + 8 + lVar50);
          pfVar3 = (float *)(lVar33 + uVar62 * 4);
          uVar61 = (ulong)*(uint *)(uVar45 + 0x18 + lVar50);
          lVar4 = lVar33 + uVar61 * 4;
          uVar56 = (ulong)*(uint *)(uVar45 + 0x28 + lVar50);
          pfVar5 = (float *)(lVar33 + uVar56 * 4);
          uVar52 = *(uint *)(uVar45 + 0xc + lVar50);
          pfVar6 = (float *)(lVar33 + (ulong)uVar52 * 4);
          uVar59 = (ulong)*(uint *)(uVar45 + 0x1c + lVar50);
          lVar7 = lVar33 + uVar59 * 4;
          uVar57 = (ulong)*(uint *)(uVar45 + 0x2c + lVar50);
          pfVar8 = (float *)(lVar33 + uVar57 * 4);
          pfVar9 = (float *)(lVar34 + (ulong)*(uint *)(uVar45 + lVar50) * 4);
          pfVar10 = (float *)(lVar34 + uVar49 * 4);
          fVar114 = fVar114 - fVar69;
          pfVar11 = (float *)(lVar34 + uVar65 * 4);
          pfVar12 = (float *)(lVar34 + uVar62 * 4);
          local_b78 = (float)uVar42;
          fStack_b74 = (float)((ulong)uVar42 >> 0x20);
          fStack_b70 = (float)uVar43;
          pfVar13 = (float *)(lVar34 + (ulong)uVar52 * 4);
          local_b68 = CONCAT44(pfVar8[2],pfVar5[2]);
          pfVar14 = (float *)(lVar34 + uVar61 * 4);
          pfVar15 = (float *)(lVar34 + uVar54 * 4);
          pfVar16 = (float *)(lVar34 + uVar59 * 4);
          pfVar17 = (float *)(lVar34 + uVar46 * 4);
          pfVar18 = (float *)(lVar34 + uVar56 * 4);
          pfVar19 = (float *)(lVar34 + uVar55 * 4);
          pfVar20 = (float *)(lVar34 + uVar57 * 4);
          fVar153 = 1.0 - fVar114;
          fStack_b6c = (float)((ulong)uVar43 >> 0x20);
          puVar1 = (undefined8 *)(uVar45 + 0x30 + lVar50);
          local_928 = *puVar1;
          uStack_920 = puVar1[1];
          puVar1 = (undefined8 *)(uVar45 + 0x40 + lVar50);
          local_938 = *puVar1;
          uStack_930 = puVar1[1];
          local_8e8 = &mapUV;
          fVar69 = *(float *)(ray + k * 4);
          fVar86 = *(float *)(ray + k * 4 + 0x10);
          fVar159 = *(float *)(ray + k * 4 + 0x20);
          fVar115 = (*pfVar21 * fVar153 + *pfVar9 * fVar114) - fVar69;
          fVar116 = (*pfVar23 * fVar153 + *pfVar11 * fVar114) - fVar69;
          fVar117 = (*pfVar3 * fVar153 + *pfVar12 * fVar114) - fVar69;
          fVar118 = (*pfVar6 * fVar153 + *pfVar13 * fVar114) - fVar69;
          fVar144 = (pfVar21[1] * fVar153 + pfVar9[1] * fVar114) - fVar86;
          fVar147 = (pfVar23[1] * fVar153 + pfVar11[1] * fVar114) - fVar86;
          fVar149 = (pfVar3[1] * fVar153 + pfVar12[1] * fVar114) - fVar86;
          fVar151 = (pfVar6[1] * fVar153 + pfVar13[1] * fVar114) - fVar86;
          fVar110 = (pfVar21[2] * fVar153 + pfVar9[2] * fVar114) - fVar159;
          fVar112 = (pfVar23[2] * fVar153 + pfVar11[2] * fVar114) - fVar159;
          fStack_ab0 = (fStack_ab0 * fVar153 + pfVar12[2] * fVar114) - fVar159;
          fStack_aac = (fStack_aac * fVar153 + pfVar13[2] * fVar114) - fVar159;
          fVar119 = (*pfVar22 * fVar153 + *pfVar10 * fVar114) - fVar69;
          fVar120 = (*pfVar24 * fVar153 + *pfVar15 * fVar114) - fVar69;
          fVar121 = (fStack_b40 * fVar153 + *pfVar14 * fVar114) - fVar69;
          fVar122 = (fStack_b3c * fVar153 + *pfVar16 * fVar114) - fVar69;
          fVar160 = (pfVar22[1] * fVar153 + pfVar10[1] * fVar114) - fVar86;
          fVar164 = (pfVar24[1] * fVar153 + pfVar15[1] * fVar114) - fVar86;
          fVar167 = (*(float *)(lVar4 + 4) * fVar153 + pfVar14[1] * fVar114) - fVar86;
          fVar170 = (*(float *)(lVar7 + 4) * fVar153 + pfVar16[1] * fVar114) - fVar86;
          fVar100 = (pfVar22[2] * fVar153 + pfVar10[2] * fVar114) - fVar159;
          fVar104 = (pfVar24[2] * fVar153 + pfVar15[2] * fVar114) - fVar159;
          fVar106 = (*(float *)(lVar4 + 8) * fVar153 + pfVar14[2] * fVar114) - fVar159;
          fVar108 = (*(float *)(lVar7 + 8) * fVar153 + pfVar16[2] * fVar114) - fVar159;
          fVar123 = (local_b78 * fVar153 + *pfVar17 * fVar114) - fVar69;
          fVar125 = (*pfVar2 * fVar153 + *pfVar19 * fVar114) - fVar69;
          fVar127 = (*pfVar5 * fVar153 + *pfVar18 * fVar114) - fVar69;
          fVar69 = (*pfVar8 * fVar153 + *pfVar20 * fVar114) - fVar69;
          fVar87 = (fStack_b74 * fVar153 + pfVar17[1] * fVar114) - fVar86;
          fVar89 = (pfVar2[1] * fVar153 + pfVar19[1] * fVar114) - fVar86;
          fVar90 = (pfVar5[1] * fVar153 + pfVar18[1] * fVar114) - fVar86;
          fVar86 = (pfVar8[1] * fVar153 + pfVar20[1] * fVar114) - fVar86;
          fVar154 = (fVar153 * fStack_b70 + fVar114 * pfVar17[2]) - fVar159;
          fVar157 = (fVar153 * pfVar2[2] + fVar114 * pfVar19[2]) - fVar159;
          fVar158 = (fVar153 * fStack_b70 + fVar114 * pfVar18[2]) - fVar159;
          fVar159 = (fVar153 * fStack_b6c + fVar114 * pfVar20[2]) - fVar159;
          fVar101 = fVar123 - fVar115;
          fVar105 = fVar125 - fVar116;
          fVar107 = fVar127 - fVar117;
          fVar109 = fVar69 - fVar118;
          fVar130 = fVar87 - fVar144;
          fVar133 = fVar89 - fVar147;
          fVar135 = fVar90 - fVar149;
          fVar137 = fVar86 - fVar151;
          fVar124 = fVar154 - fVar110;
          fVar126 = fVar157 - fVar112;
          fVar128 = fVar158 - fStack_ab0;
          fVar129 = fVar159 - fStack_aac;
          fVar114 = *(float *)(ray + k * 4 + 0x50);
          fVar153 = *(float *)(ray + k * 4 + 0x60);
          fVar97 = *(float *)(ray + k * 4 + 0x40);
          local_918 = (fVar130 * (fVar154 + fVar110) - (fVar87 + fVar144) * fVar124) * fVar97 +
                      ((fVar123 + fVar115) * fVar124 - (fVar154 + fVar110) * fVar101) * fVar114 +
                      (fVar101 * (fVar87 + fVar144) - (fVar123 + fVar115) * fVar130) * fVar153;
          fStack_914 = (fVar133 * (fVar157 + fVar112) - (fVar89 + fVar147) * fVar126) * fVar97 +
                       ((fVar125 + fVar116) * fVar126 - (fVar157 + fVar112) * fVar105) * fVar114 +
                       (fVar105 * (fVar89 + fVar147) - (fVar125 + fVar116) * fVar133) * fVar153;
          fStack_910 = (fVar135 * (fVar158 + fStack_ab0) - (fVar90 + fVar149) * fVar128) * fVar97 +
                       ((fVar127 + fVar117) * fVar128 - (fVar158 + fStack_ab0) * fVar107) * fVar114
                       + (fVar107 * (fVar90 + fVar149) - (fVar127 + fVar117) * fVar135) * fVar153;
          fStack_90c = (fVar137 * (fVar159 + fStack_aac) - (fVar86 + fVar151) * fVar129) * fVar97 +
                       ((fVar69 + fVar118) * fVar129 - (fVar159 + fStack_aac) * fVar109) * fVar114 +
                       (fVar109 * (fVar86 + fVar151) - (fVar69 + fVar118) * fVar137) * fVar153;
          fVar139 = fVar115 - fVar119;
          fVar141 = fVar116 - fVar120;
          fVar142 = fVar117 - fVar121;
          fVar143 = fVar118 - fVar122;
          fVar131 = fVar144 - fVar160;
          fVar134 = fVar147 - fVar164;
          fVar136 = fVar149 - fVar167;
          fVar138 = fVar151 - fVar170;
          fVar161 = fVar110 - fVar100;
          fVar165 = fVar112 - fVar104;
          fVar168 = fStack_ab0 - fVar106;
          fVar171 = fStack_aac - fVar108;
          local_908._0_4_ =
               (fVar131 * (fVar110 + fVar100) - (fVar144 + fVar160) * fVar161) * fVar97 +
               ((fVar115 + fVar119) * fVar161 - (fVar110 + fVar100) * fVar139) * fVar114 +
               (fVar139 * (fVar144 + fVar160) - (fVar115 + fVar119) * fVar131) * fVar153;
          local_908._4_4_ =
               (fVar134 * (fVar112 + fVar104) - (fVar147 + fVar164) * fVar165) * fVar97 +
               ((fVar116 + fVar120) * fVar165 - (fVar112 + fVar104) * fVar141) * fVar114 +
               (fVar141 * (fVar147 + fVar164) - (fVar116 + fVar120) * fVar134) * fVar153;
          local_908._8_4_ =
               (fVar136 * (fStack_ab0 + fVar106) - (fVar149 + fVar167) * fVar168) * fVar97 +
               ((fVar117 + fVar121) * fVar168 - (fStack_ab0 + fVar106) * fVar142) * fVar114 +
               (fVar142 * (fVar149 + fVar167) - (fVar117 + fVar121) * fVar136) * fVar153;
          local_908._12_4_ =
               (fVar138 * (fStack_aac + fVar108) - (fVar151 + fVar170) * fVar171) * fVar97 +
               ((fVar118 + fVar122) * fVar171 - (fStack_aac + fVar108) * fVar143) * fVar114 +
               (fVar143 * (fVar151 + fVar170) - (fVar118 + fVar122) * fVar138) * fVar153;
          fVar162 = fVar119 - fVar123;
          fVar166 = fVar120 - fVar125;
          fVar169 = fVar121 - fVar127;
          fVar172 = fVar122 - fVar69;
          fVar111 = fVar160 - fVar87;
          fVar113 = fVar164 - fVar89;
          fStack_b40 = fVar167 - fVar90;
          fStack_b3c = fVar170 - fVar86;
          fVar145 = fVar100 - fVar154;
          fVar148 = fVar104 - fVar157;
          fVar150 = fVar106 - fVar158;
          fVar152 = fVar108 - fVar159;
          auVar71._0_4_ =
               (fVar111 * (fVar154 + fVar100) - (fVar87 + fVar160) * fVar145) * fVar97 +
               ((fVar123 + fVar119) * fVar145 - (fVar154 + fVar100) * fVar162) * fVar114 +
               (fVar162 * (fVar87 + fVar160) - (fVar123 + fVar119) * fVar111) * fVar153;
          auVar71._4_4_ =
               (fVar113 * (fVar157 + fVar104) - (fVar89 + fVar164) * fVar148) * fVar97 +
               ((fVar125 + fVar120) * fVar148 - (fVar157 + fVar104) * fVar166) * fVar114 +
               (fVar166 * (fVar89 + fVar164) - (fVar125 + fVar120) * fVar113) * fVar153;
          auVar71._8_4_ =
               (fStack_b40 * (fVar158 + fVar106) - (fVar90 + fVar167) * fVar150) * fVar97 +
               ((fVar127 + fVar121) * fVar150 - (fVar158 + fVar106) * fVar169) * fVar114 +
               (fVar169 * (fVar90 + fVar167) - (fVar127 + fVar121) * fStack_b40) * fVar153;
          auVar71._12_4_ =
               (fStack_b3c * (fVar159 + fVar108) - (fVar86 + fVar170) * fVar152) * fVar97 +
               ((fVar69 + fVar122) * fVar152 - (fVar159 + fVar108) * fVar172) * fVar114 +
               (fVar172 * (fVar86 + fVar170) - (fVar69 + fVar122) * fStack_b3c) * fVar153;
          fVar89 = local_918 + local_908._0_4_ + auVar71._0_4_;
          fVar90 = fStack_914 + local_908._4_4_ + auVar71._4_4_;
          fVar100 = fStack_910 + local_908._8_4_ + auVar71._8_4_;
          fVar104 = fStack_90c + local_908._12_4_ + auVar71._12_4_;
          auVar79._4_4_ = fStack_914;
          auVar79._0_4_ = local_918;
          auVar79._8_4_ = fStack_910;
          auVar79._12_4_ = fStack_90c;
          auVar77 = minps(auVar79,local_908);
          auVar77 = minps(auVar77,auVar71);
          auVar155._4_4_ = fStack_914;
          auVar155._0_4_ = local_918;
          auVar155._8_4_ = fStack_910;
          auVar155._12_4_ = fStack_90c;
          auVar93 = maxps(auVar155,local_908);
          auVar93 = maxps(auVar93,auVar71);
          fVar69 = ABS(fVar89) * 1.1920929e-07;
          fVar86 = ABS(fVar90) * 1.1920929e-07;
          fVar159 = ABS(fVar100) * 1.1920929e-07;
          fVar87 = ABS(fVar104) * 1.1920929e-07;
          auVar156._4_4_ = -(uint)(auVar93._4_4_ <= fVar86);
          auVar156._0_4_ = -(uint)(auVar93._0_4_ <= fVar69);
          auVar156._8_4_ = -(uint)(auVar93._8_4_ <= fVar159);
          auVar156._12_4_ = -(uint)(auVar93._12_4_ <= fVar87);
          auVar80._4_4_ = -(uint)(-fVar86 <= auVar77._4_4_);
          auVar80._0_4_ = -(uint)(-fVar69 <= auVar77._0_4_);
          auVar80._8_4_ = -(uint)(-fVar159 <= auVar77._8_4_);
          auVar80._12_4_ = -(uint)(-fVar87 <= auVar77._12_4_);
          auVar156 = auVar156 | auVar80;
          iVar44 = movmskps((int)&mapUV,auVar156);
          if (iVar44 != 0) {
            auVar132._0_4_ = fVar131 * fVar145 - fVar111 * fVar161;
            auVar132._4_4_ = fVar134 * fVar148 - fVar113 * fVar165;
            auVar132._8_4_ = fVar136 * fVar150 - fStack_b40 * fVar168;
            auVar132._12_4_ = fVar138 * fVar152 - fStack_b3c * fVar171;
            auVar72._4_4_ = -(uint)(ABS(fVar134 * fVar126) < ABS(fVar113 * fVar165));
            auVar72._0_4_ = -(uint)(ABS(fVar131 * fVar124) < ABS(fVar111 * fVar161));
            auVar72._8_4_ = -(uint)(ABS(fVar136 * fVar128) < ABS(fStack_b40 * fVar168));
            auVar72._12_4_ = -(uint)(ABS(fVar138 * fVar129) < ABS(fStack_b3c * fVar171));
            auVar39._4_4_ = fVar133 * fVar165 - fVar134 * fVar126;
            auVar39._0_4_ = fVar130 * fVar161 - fVar131 * fVar124;
            auVar39._8_4_ = fVar135 * fVar168 - fVar136 * fVar128;
            auVar39._12_4_ = fVar137 * fVar171 - fVar138 * fVar129;
            local_898 = blendvps(auVar132,auVar39,auVar72);
            auVar163._0_4_ = fVar162 * fVar161 - fVar139 * fVar145;
            auVar163._4_4_ = fVar166 * fVar165 - fVar141 * fVar148;
            auVar163._8_4_ = fVar169 * fVar168 - fVar142 * fVar150;
            auVar163._12_4_ = fVar172 * fVar171 - fVar143 * fVar152;
            auVar73._4_4_ = -(uint)(ABS(fVar105 * fVar165) < ABS(fVar141 * fVar148));
            auVar73._0_4_ = -(uint)(ABS(fVar101 * fVar161) < ABS(fVar139 * fVar145));
            auVar73._8_4_ = -(uint)(ABS(fVar107 * fVar168) < ABS(fVar142 * fVar150));
            auVar73._12_4_ = -(uint)(ABS(fVar109 * fVar171) < ABS(fVar143 * fVar152));
            auVar40._4_4_ = fVar126 * fVar141 - fVar105 * fVar165;
            auVar40._0_4_ = fVar124 * fVar139 - fVar101 * fVar161;
            auVar40._8_4_ = fVar128 * fVar142 - fVar107 * fVar168;
            auVar40._12_4_ = fVar129 * fVar143 - fVar109 * fVar171;
            local_888 = blendvps(auVar163,auVar40,auVar73);
            auVar140._0_4_ = fVar139 * fVar111 - fVar162 * fVar131;
            auVar140._4_4_ = fVar141 * fVar113 - fVar166 * fVar134;
            auVar140._8_4_ = fVar142 * fStack_b40 - fVar169 * fVar136;
            auVar140._12_4_ = fVar143 * fStack_b3c - fVar172 * fVar138;
            auVar74._4_4_ = -(uint)(ABS(fVar141 * fVar133) < ABS(fVar166 * fVar134));
            auVar74._0_4_ = -(uint)(ABS(fVar139 * fVar130) < ABS(fVar162 * fVar131));
            auVar74._8_4_ = -(uint)(ABS(fVar142 * fVar135) < ABS(fVar169 * fVar136));
            auVar74._12_4_ = -(uint)(ABS(fVar143 * fVar137) < ABS(fVar172 * fVar138));
            auVar38._4_4_ = fVar105 * fVar134 - fVar141 * fVar133;
            auVar38._0_4_ = fVar101 * fVar131 - fVar139 * fVar130;
            auVar38._8_4_ = fVar107 * fVar136 - fVar142 * fVar135;
            auVar38._12_4_ = fVar109 * fVar138 - fVar143 * fVar137;
            local_878 = blendvps(auVar140,auVar38,auVar74);
            fVar87 = fVar97 * local_898._0_4_ +
                     fVar114 * local_888._0_4_ + fVar153 * local_878._0_4_;
            fVar101 = fVar97 * local_898._4_4_ +
                      fVar114 * local_888._4_4_ + fVar153 * local_878._4_4_;
            fVar105 = fVar97 * local_898._8_4_ +
                      fVar114 * local_888._8_4_ + fVar153 * local_878._8_4_;
            fVar106 = fVar97 * local_898._12_4_ +
                      fVar114 * local_888._12_4_ + fVar153 * local_878._12_4_;
            fVar87 = fVar87 + fVar87;
            fVar101 = fVar101 + fVar101;
            fVar105 = fVar105 + fVar105;
            fVar106 = fVar106 + fVar106;
            auVar81._0_4_ = fVar144 * local_888._0_4_ + fVar110 * local_878._0_4_;
            auVar81._4_4_ = fVar147 * local_888._4_4_ + fVar112 * local_878._4_4_;
            auVar81._8_4_ = fVar149 * local_888._8_4_ + fStack_ab0 * local_878._8_4_;
            auVar81._12_4_ = fVar151 * local_888._12_4_ + fStack_aac * local_878._12_4_;
            fVar153 = fVar115 * local_898._0_4_ + auVar81._0_4_;
            fVar97 = fVar116 * local_898._4_4_ + auVar81._4_4_;
            fVar121 = fVar117 * local_898._8_4_ + auVar81._8_4_;
            fVar122 = fVar118 * local_898._12_4_ + auVar81._12_4_;
            auVar41._4_4_ = fVar101;
            auVar41._0_4_ = fVar87;
            auVar41._8_4_ = fVar105;
            auVar41._12_4_ = fVar106;
            auVar77 = rcpps(auVar81,auVar41);
            fVar69 = auVar77._0_4_;
            fVar86 = auVar77._4_4_;
            fVar114 = auVar77._8_4_;
            fVar159 = auVar77._12_4_;
            local_8a8._0_4_ = ((1.0 - fVar87 * fVar69) * fVar69 + fVar69) * (fVar153 + fVar153);
            local_8a8._4_4_ = ((1.0 - fVar101 * fVar86) * fVar86 + fVar86) * (fVar97 + fVar97);
            local_8a8._8_4_ = ((1.0 - fVar105 * fVar114) * fVar114 + fVar114) * (fVar121 + fVar121);
            local_8a8._12_4_ = ((1.0 - fVar106 * fVar159) * fVar159 + fVar159) * (fVar122 + fVar122)
            ;
            fVar69 = *(float *)(ray + k * 4 + 0x80);
            fVar86 = *(float *)(ray + k * 4 + 0x30);
            auVar82._0_4_ =
                 -(uint)(local_8a8._0_4_ <= fVar69 && fVar86 <= local_8a8._0_4_) & auVar156._0_4_;
            auVar82._4_4_ =
                 -(uint)(local_8a8._4_4_ <= fVar69 && fVar86 <= local_8a8._4_4_) & auVar156._4_4_;
            auVar82._8_4_ =
                 -(uint)(local_8a8._8_4_ <= fVar69 && fVar86 <= local_8a8._8_4_) & auVar156._8_4_;
            auVar82._12_4_ =
                 -(uint)(local_8a8._12_4_ <= fVar69 && fVar86 <= local_8a8._12_4_) & auVar156._12_4_
            ;
            iVar44 = movmskps(iVar44,auVar82);
            fVar121 = fStack_b40;
            fVar122 = fStack_b3c;
            if (iVar44 != 0) {
              local_8d8._0_4_ = auVar82._0_4_ & -(uint)(fVar87 != 0.0);
              local_8d8._4_4_ = auVar82._4_4_ & -(uint)(fVar101 != 0.0);
              local_8d8._8_4_ = auVar82._8_4_ & -(uint)(fVar105 != 0.0);
              local_8d8._12_4_ = auVar82._12_4_ & -(uint)(fVar106 != 0.0);
              uVar52 = movmskps(uVar52,local_8d8);
              uVar49 = (ulong)uVar52;
              if (uVar52 != 0) {
                local_8f8._4_4_ = fVar90;
                local_8f8._0_4_ = fVar89;
                local_8f8._8_4_ = fVar100;
                local_8f8._12_4_ = fVar104;
                local_8e8 = &mapUV;
                auVar77 = rcpps(local_8a8,local_8f8);
                fVar69 = auVar77._0_4_;
                fVar86 = auVar77._4_4_;
                fVar114 = auVar77._8_4_;
                fVar159 = auVar77._12_4_;
                fVar69 = (float)(-(uint)(1e-18 <= ABS(fVar89)) &
                                (uint)(((float)DAT_01feca10 - fVar89 * fVar69) * fVar69 + fVar69));
                fVar86 = (float)(-(uint)(1e-18 <= ABS(fVar90)) &
                                (uint)((DAT_01feca10._4_4_ - fVar90 * fVar86) * fVar86 + fVar86));
                fVar114 = (float)(-(uint)(1e-18 <= ABS(fVar100)) &
                                 (uint)((DAT_01feca10._8_4_ - fVar100 * fVar114) * fVar114 + fVar114
                                       ));
                fVar159 = (float)(-(uint)(1e-18 <= ABS(fVar104)) &
                                 (uint)((DAT_01feca10._12_4_ - fVar104 * fVar159) * fVar159 +
                                       fVar159));
                auVar103._0_4_ = local_918 * fVar69;
                auVar103._4_4_ = fStack_914 * fVar86;
                auVar103._8_4_ = fStack_910 * fVar114;
                auVar103._12_4_ = fStack_90c * fVar159;
                local_8c8 = minps(auVar103,_DAT_01feca10);
                auVar146._0_4_ = fVar69 * local_908._0_4_;
                auVar146._4_4_ = fVar86 * local_908._4_4_;
                auVar146._8_4_ = fVar114 * local_908._8_4_;
                auVar146._12_4_ = fVar159 * local_908._12_4_;
                local_8b8 = minps(auVar146,_DAT_01feca10);
                do {
                  uVar46 = 0;
                  if (uVar49 != 0) {
                    for (; (uVar49 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                    }
                  }
                  local_808 = *(uint *)((long)&local_928 + uVar46 * 4);
                  pGVar32 = (pSVar31->geometries).items[local_808].ptr;
                  if ((pGVar32->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    uVar49 = uVar49 ^ 1L << (uVar46 & 0x3f);
                    bVar67 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (pGVar32->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar67 = false;
                  }
                  else {
                    uVar51 = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_838 = *(undefined4 *)(local_8c8 + uVar46 * 4);
                    uVar29 = *(undefined4 *)(local_8b8 + uVar46 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a8 + uVar46 * 4);
                    args.context = context->user;
                    uVar30 = *(undefined4 *)((long)&local_938 + uVar46 * 4);
                    local_818._4_4_ = uVar30;
                    local_818._0_4_ = uVar30;
                    local_818._8_4_ = uVar30;
                    local_818._12_4_ = uVar30;
                    local_828._4_4_ = uVar29;
                    local_828._0_4_ = uVar29;
                    local_828._8_4_ = uVar29;
                    local_828._12_4_ = uVar29;
                    uVar29 = *(undefined4 *)(local_898 + uVar46 * 4);
                    local_858 = *(undefined4 *)(local_888 + uVar46 * 4);
                    local_848 = *(undefined4 *)(local_878 + uVar46 * 4);
                    local_868[0] = (RTCHitN)(char)uVar29;
                    local_868[1] = (RTCHitN)(char)((uint)uVar29 >> 8);
                    local_868[2] = (RTCHitN)(char)((uint)uVar29 >> 0x10);
                    local_868[3] = (RTCHitN)(char)((uint)uVar29 >> 0x18);
                    local_868[4] = (RTCHitN)(char)uVar29;
                    local_868[5] = (RTCHitN)(char)((uint)uVar29 >> 8);
                    local_868[6] = (RTCHitN)(char)((uint)uVar29 >> 0x10);
                    local_868[7] = (RTCHitN)(char)((uint)uVar29 >> 0x18);
                    local_868[8] = (RTCHitN)(char)uVar29;
                    local_868[9] = (RTCHitN)(char)((uint)uVar29 >> 8);
                    local_868[10] = (RTCHitN)(char)((uint)uVar29 >> 0x10);
                    local_868[0xb] = (RTCHitN)(char)((uint)uVar29 >> 0x18);
                    local_868[0xc] = (RTCHitN)(char)uVar29;
                    local_868[0xd] = (RTCHitN)(char)((uint)uVar29 >> 8);
                    local_868[0xe] = (RTCHitN)(char)((uint)uVar29 >> 0x10);
                    local_868[0xf] = (RTCHitN)(char)((uint)uVar29 >> 0x18);
                    uStack_854 = local_858;
                    uStack_850 = local_858;
                    uStack_84c = local_858;
                    uStack_844 = local_848;
                    uStack_840 = local_848;
                    uStack_83c = local_848;
                    uStack_834 = local_838;
                    uStack_830 = local_838;
                    uStack_82c = local_838;
                    uStack_804 = local_808;
                    uStack_800 = local_808;
                    uStack_7fc = local_808;
                    local_7f8 = (args.context)->instID[0];
                    uStack_7f4 = local_7f8;
                    uStack_7f0 = local_7f8;
                    uStack_7ec = local_7f8;
                    local_7e8 = (args.context)->instPrimID[0];
                    uStack_7e4 = local_7e8;
                    uStack_7e0 = local_7e8;
                    uStack_7dc = local_7e8;
                    local_aa8 = *local_a98;
                    args.valid = (int *)local_aa8;
                    args.geometryUserPtr = pGVar32->userPtr;
                    args.hit = local_868;
                    args.N = 4;
                    pRVar47 = (RTCRayN *)pGVar32->occlusionFilterN;
                    args.ray = (RTCRayN *)ray;
                    if (pRVar47 != (RTCRayN *)0x0) {
                      pRVar47 = (RTCRayN *)(*(code *)pRVar47)(&args);
                      k = local_b68;
                    }
                    if (local_aa8 == (undefined1  [16])0x0) {
                      auVar83._8_4_ = 0xffffffff;
                      auVar83._0_8_ = 0xffffffffffffffff;
                      auVar83._12_4_ = 0xffffffff;
                      auVar83 = auVar83 ^ _DAT_01febe20;
                    }
                    else {
                      p_Var35 = context->args->filter;
                      if ((p_Var35 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar32->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var35)(&args);
                        k = local_b68;
                      }
                      auVar75._0_4_ = -(uint)(local_aa8._0_4_ == 0);
                      auVar75._4_4_ = -(uint)(local_aa8._4_4_ == 0);
                      auVar75._8_4_ = -(uint)(local_aa8._8_4_ == 0);
                      auVar75._12_4_ = -(uint)(local_aa8._12_4_ == 0);
                      auVar83 = auVar75 ^ _DAT_01febe20;
                      auVar77 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),
                                         auVar75);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar77;
                      pRVar47 = args.ray;
                    }
                    auVar84._0_4_ = auVar83._0_4_ << 0x1f;
                    auVar84._4_4_ = auVar83._4_4_ << 0x1f;
                    auVar84._8_4_ = auVar83._8_4_ << 0x1f;
                    auVar84._12_4_ = auVar83._12_4_ << 0x1f;
                    iVar44 = movmskps((int)pRVar47,auVar84);
                    bVar67 = iVar44 == 0;
                    if (bVar67) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar51;
                      uVar49 = uVar49 ^ 1L << (uVar46 & 0x3f);
                    }
                  }
                  if (!bVar67) {
                    if (bVar66) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                      uVar63 = 1;
                    }
                    goto LAB_0027a47e;
                  }
                } while (uVar49 != 0);
              }
            }
          }
          fStack_b3c = fVar122;
          fStack_b40 = fVar121;
          local_a88 = local_a88 + 1;
          bVar66 = local_a88 < local_a90;
          sVar48 = k;
        } while (local_a88 != local_a90);
      }
    }
LAB_0027a47e:
  } while ((uVar63 & 3) == 0);
  return local_a80 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }